

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::parse_from_stream(App *this,istream *input)

{
  long in_RDI;
  istream *in_stack_00000018;
  App *in_stack_00000020;
  bool in_stack_0000005e;
  bool in_stack_0000005f;
  App *in_stack_00000060;
  App *in_stack_00000100;
  
  if (*(int *)(in_RDI + 0x2e4) == 0) {
    _validate(in_stack_00000100);
    _configure(this);
  }
  _parse_stream(in_stack_00000020,in_stack_00000018);
  run_callback(in_stack_00000060,in_stack_0000005f,in_stack_0000005e);
  return;
}

Assistant:

CLI11_INLINE void App::parse_from_stream(std::istream &input) {
    if(parsed_ == 0) {
        _validate();
        _configure();
        // set the parent as nullptr as this object should be the top now
    }

    _parse_stream(input);
    run_callback();
}